

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_data.cpp
# Opt level: O2

unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true> __thiscall
duckdb::ColumnData::GetStatistics(ColumnData *this)

{
  InternalException *this_00;
  long in_RSI;
  allocator local_41;
  string local_40;
  
  if (*(long *)(in_RSI + 0xf0) != 0) {
    ::std::mutex::lock((mutex *)&((pthread_mutex_t *)(in_RSI + 200))->__data);
    unique_ptr<duckdb::SegmentStatistics,_std::default_delete<duckdb::SegmentStatistics>,_true>::
    operator->((unique_ptr<duckdb::SegmentStatistics,_std::default_delete<duckdb::SegmentStatistics>,_true>
                *)(in_RSI + 0xf0));
    BaseStatistics::ToUnique((BaseStatistics *)this);
    pthread_mutex_unlock((pthread_mutex_t *)(in_RSI + 200));
    return (unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>)
           (unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>)this;
  }
  this_00 = (InternalException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_40,"ColumnData::GetStatistics called on a column without stats",
             &local_41);
  InternalException::InternalException(this_00,&local_40);
  __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void ColumnData::MergeStatistics(const BaseStatistics &other) {
	if (!stats) {
		throw InternalException("ColumnData::MergeStatistics called on a column without stats");
	}
	lock_guard<mutex> l(stats_lock);
	return stats->statistics.Merge(other);
}